

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

void ktxVulkanDeviceInfo_Destroy(ktxVulkanDeviceInfo *This)

{
  if (This != (ktxVulkanDeviceInfo *)0x0) {
    ktxVulkanDeviceInfo_Destruct(This);
    free(This);
    return;
  }
  __assert_fail("This != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                ,0x187,"void ktxVulkanDeviceInfo_Destroy(ktxVulkanDeviceInfo *)");
}

Assistant:

void
ktxVulkanDeviceInfo_Destroy(ktxVulkanDeviceInfo* This)
{
    assert(This != NULL);
    ktxVulkanDeviceInfo_Destruct(This);
    free(This);
}